

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

FilePathSpecSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::FilePathSpecSyntax,slang::syntax::FilePathSpecSyntax_const&>
          (BumpAllocator *this,FilePathSpecSyntax *args)

{
  SyntaxNode *pSVar1;
  TokenKind TVar2;
  undefined1 uVar3;
  NumericTokenFlags NVar4;
  uint32_t uVar5;
  SyntaxKind SVar6;
  undefined4 uVar7;
  FilePathSpecSyntax *pFVar8;
  
  pFVar8 = (FilePathSpecSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((FilePathSpecSyntax *)this->endPtr < pFVar8 + 1) {
    pFVar8 = (FilePathSpecSyntax *)allocateSlow(this,0x28,8);
  }
  else {
    this->head->current = (byte *)(pFVar8 + 1);
  }
  (pFVar8->path).info = (args->path).info;
  SVar6 = (args->super_SyntaxNode).kind;
  uVar7 = *(undefined4 *)&(args->super_SyntaxNode).field_0x4;
  pSVar1 = (args->super_SyntaxNode).parent;
  TVar2 = (args->path).kind;
  uVar3 = (args->path).field_0x2;
  NVar4.raw = (args->path).numFlags.raw;
  uVar5 = (args->path).rawLen;
  (pFVar8->super_SyntaxNode).previewNode = (args->super_SyntaxNode).previewNode;
  (pFVar8->path).kind = TVar2;
  (pFVar8->path).field_0x2 = uVar3;
  (pFVar8->path).numFlags = (NumericTokenFlags)NVar4.raw;
  (pFVar8->path).rawLen = uVar5;
  (pFVar8->super_SyntaxNode).kind = SVar6;
  *(undefined4 *)&(pFVar8->super_SyntaxNode).field_0x4 = uVar7;
  (pFVar8->super_SyntaxNode).parent = pSVar1;
  return pFVar8;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }